

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int do_sftp(int mode,int modeflags,char *batchfile)

{
  int iVar1;
  sftp_command *psVar2;
  FILE *__stream;
  sftp_command *cmd_1;
  sftp_command *cmd;
  int ret;
  FILE *fp;
  char *batchfile_local;
  int modeflags_local;
  int mode_local;
  
  if (mode == 0) {
    do {
      psVar2 = sftp_getcmd((FILE *)0x0,0,0);
      if (psVar2 == (sftp_command *)0x0) {
        return 0;
      }
      iVar1 = (*psVar2->obey)(psVar2);
      sftp_cmd_free(psVar2);
    } while (-1 < iVar1);
  }
  else {
    __stream = fopen(batchfile,"r");
    if (__stream == (FILE *)0x0) {
      printf("Fatal: unable to open %s\n",batchfile);
      return 1;
    }
    cmd._4_4_ = 0;
    while (psVar2 = sftp_getcmd((FILE *)__stream,mode,modeflags), psVar2 != (sftp_command *)0x0) {
      cmd._4_4_ = (*psVar2->obey)(psVar2);
      sftp_cmd_free(psVar2);
      if ((cmd._4_4_ < 0) || ((cmd._4_4_ == 0 && ((modeflags & 2U) == 0)))) break;
    }
    fclose(__stream);
    if ((cmd._4_4_ == 0) && ((modeflags & 2U) == 0)) {
      return 2;
    }
  }
  return 0;
}

Assistant:

int do_sftp(int mode, int modeflags, char *batchfile)
{
    FILE *fp;
    int ret;

    /*
     * Batch mode?
     */
    if (mode == 0) {

        /* ------------------------------------------------------------------
         * Now we're ready to do Real Stuff.
         */
        while (1) {
            struct sftp_command *cmd;
            cmd = sftp_getcmd(NULL, 0, 0);
            if (!cmd)
                break;
            ret = cmd->obey(cmd);
            sftp_cmd_free(cmd);
            if (ret < 0)
                break;
        }
    } else {
        fp = fopen(batchfile, "r");
        if (!fp) {
            printf("Fatal: unable to open %s\n", batchfile);
            return 1;
        }
        ret = 0;
        while (1) {
            struct sftp_command *cmd;
            cmd = sftp_getcmd(fp, mode, modeflags);
            if (!cmd)
                break;
            ret = cmd->obey(cmd);
            sftp_cmd_free(cmd);
            if (ret < 0)
                break;
            if (ret == 0) {
                if (!(modeflags & 2))
                    break;
            }
        }
        fclose(fp);
        /*
         * In batch mode, and if exit on command failure is enabled,
         * any command failure causes the whole of PSFTP to fail.
         */
        if (ret == 0 && !(modeflags & 2)) return 2;
    }
    return 0;
}